

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  string code;
  Script script;
  char cmd [256];
  State state;
  Memory memory;
  uint local_cac;
  char *local_ca8;
  undefined8 local_ca0;
  char local_c98 [16];
  Script local_c88;
  string local_c68;
  string local_c48 [8];
  State local_b48;
  Memory local_a58;
  
  LiteScript::Memory::Memory(&local_a58);
  LiteScript::State::State(&local_b48,&local_a58);
  LiteScript::Script::Script(&local_c88,&local_b48);
  LiteScript::CreateVariable((LiteScript *)local_c48,&local_a58,print_var);
  LiteScript::DeclareVariable(&local_b48,"print",(Variable *)local_c48);
  LiteScript::Variable::~Variable((Variable *)local_c48);
  if (1 < argc) {
    readfile_abi_cxx11_(local_c48,argv[1],(uint *)&local_ca8);
    iVar1 = std::__cxx11::string::compare((char *)local_c48);
    if (iVar1 == 0) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          (char *)CONCAT44(local_c48[0]._M_dataplus._M_p._4_4_,
                                           (int)local_c48[0]._M_dataplus._M_p),
                          local_c48[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," \"",2);
      pcVar3 = argv[1];
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      iVar1 = -1;
      std::ostream::flush();
    }
    else {
      LiteScript::Script::Execute
                (&local_c88,
                 (char *)CONCAT44(local_c48[0]._M_dataplus._M_p._4_4_,
                                  (int)local_c48[0]._M_dataplus._M_p));
      if (local_c88.error == SCRPT_ERROR_NO) {
        iVar1 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR(",6);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"): ",3);
        pcVar3 = LiteScript::Script::GetError(&local_c88);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
        }
        else {
          sVar4 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        iVar1 = 1;
        std::ostream::flush();
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_c48[0]._M_dataplus._M_p._4_4_,(int)local_c48[0]._M_dataplus._M_p) !=
        &local_c48[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_c48[0]._M_dataplus._M_p._4_4_,
                               (int)local_c48[0]._M_dataplus._M_p));
    }
LAB_0011c6e7:
    std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::~vector(&local_b48.nsp_lifo)
    ;
    if (local_b48.call_lifo.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b48.call_lifo.
                      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
              (&local_b48.op_lifo);
    std::
    vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
    ::~vector(&local_b48.rets);
    std::
    vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
    ::~vector(&local_b48.ths);
    std::
    vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
    ::~vector(&local_b48.args_def);
    std::
    vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
    ::~vector(&local_b48.args_tmp);
    LiteScript::Variable::~Variable(&local_b48.nsp_global);
    std::
    vector<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
    ::~vector(&local_b48.instr);
    LiteScript::Memory::~Memory(&local_a58);
    return iVar1;
  }
  local_ca8 = local_c98;
  local_ca0 = 0;
  local_c98[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter script code :",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  display_commands(4,command_help._M_elems);
  do {
    local_cac = 1;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    local_ca0 = 0;
    *local_ca8 = '\0';
    uVar5 = local_cac;
    while( true ) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," > ",3);
      std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x18);
      std::istream::getline((char *)&std::cin,(long)local_c48,'\0');
      if (local_c48[0]._M_dataplus._M_p._4_1_ == ' ' &&
          (int)local_c48[0]._M_dataplus._M_p == 0x656c6966) break;
      if ((int)local_c48[0]._M_dataplus._M_p == 0x706c6568) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Commands :",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
        display_commands(4,command_help._M_elems);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
      }
      else {
        if (local_c48[0]._M_dataplus._M_p._4_1_ == '\0' &&
            (int)local_c48[0]._M_dataplus._M_p == 0x74697865) {
          if (local_ca8 != local_c98) {
            operator_delete(local_ca8);
          }
          iVar1 = 0;
          goto LAB_0011c6e7;
        }
        if ((char)local_c48[0]._M_dataplus._M_p == '\0') goto LAB_0011c4ca;
        std::__cxx11::string::append((char *)&local_ca8);
        std::__cxx11::string::push_back((char)&local_ca8);
        uVar5 = uVar5 + 1;
      }
    }
    local_cac = uVar5;
    readfile_abi_cxx11_(&local_c68,(char *)((long)&local_c48[0]._M_dataplus._M_p + 5),&local_cac);
    std::__cxx11::string::_M_append((char *)&local_ca8,(ulong)local_c68._M_dataplus._M_p);
    uVar5 = local_cac;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
      operator_delete(local_c68._M_dataplus._M_p);
      uVar5 = local_cac;
    }
LAB_0011c4ca:
    local_cac = uVar5;
    std::__cxx11::string::pop_back();
    LiteScript::Script::Execute(&local_c88,local_ca8);
    if (local_c88.error != SCRPT_ERROR_NO) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR(",6);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"): ",3);
      pcVar3 = LiteScript::Script::GetError(&local_c88);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    // We create the main memory and the script state
    Memory memory;
    State state(memory);
    // We create an assembly object
    Script script(state);

    // We add the "print" callback in the global namespace
    DeclareVariable(state, "print", CreateVariable(memory, print_var));

    // If there is a parameter, it's a file assembly script to execute
    if (argc > 1) {
        unsigned int i;
        // We read the file content
        std::string code = readfile(argv[1], i);
        if (code == "error : can't open the file") {
            std::cout << code << " \"" << argv[1] << "\"" << std::endl;
            return -1;
        }

        // We execute the script
        script.Execute(code.c_str());
        // If there is an error, we print it
        if (script.error != Script::ErrorType::SCRPT_ERROR_NO) {
            std::cout << "ERROR(" << (script.line_error + 1) << "," << (script.col_error + 1) << "): " << script.GetError() << std::endl;
            return 1;
        }
        return 0;
    }

    // Else we read lines on the keyboard
    // (the script execution is relatively the same as above)
    char cmd[256];
    std::string code;
    unsigned int line_num;
    std::cout << "Enter script code :" << std::endl;
    display_commands(command_help.size(), command_help.data());
    while (true) {
        line_num = 1;
        std::cout << std::endl;
        code.clear();
        while (true) {
            std::cout << line_num << " > ";
            std::cin.getline(cmd, 256);
            if (strncmp(cmd, "file ", 5) == 0) {
                code += readfile(cmd + 5, line_num);
                break;
            }
            else if (strncmp(cmd, "help", 4) == 0) {
                std::cout << "Commands :" << std::endl;
                display_commands(command_help.size(), command_help.data());
                std::cout << std::endl;
                continue;
            }
            else if (strcmp(cmd, "exit") == 0)
                return 0;
            else if (cmd[0] == '\0')
                break;
            code += cmd;
            code += '\n';
            line_num++;
        }
        code.pop_back();

        script.Execute(code.c_str());
        if (script.error != Script::ErrorType::SCRPT_ERROR_NO)
            std::cout << "ERROR(" << (script.line_error + 1) << "," << (script.col_error + 1) << "): " << script.GetError() << std::endl;
    }
}